

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O3

void cmSHA256_Internal_Last(SHA_CTX *context)

{
  cm_sha2_uint64_t *data;
  ulong uVar1;
  uint uVar2;
  
  uVar1 = (context->s256).bitcount;
  uVar2 = (uint)(uVar1 >> 3) & 0x3f;
  (context->s256).bitcount =
       uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
       (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
       (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  data = (context->s512).state + 5;
  if ((uVar1 >> 3 & 0x3f) == 0) {
    *data = 0;
    (context->s512).state[6] = 0;
    (context->s512).bitcount[1] = 0;
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x30] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x31] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x32] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x33] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x34] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x35] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x36] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x37] = '\0';
    (context->s512).state[7] = 0;
    (context->s512).bitcount[0] = 0;
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x38] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x39] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3a] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3b] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3c] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3d] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3e] = '\0';
    ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3f] = '\0';
    *(undefined1 *)data = 0x80;
  }
  else {
    *(undefined1 *)((long)data + (ulong)uVar2) = 0x80;
    if (uVar2 < 0x38) {
      memset((void *)((ulong)(uVar2 + 1) + (long)data),0,(ulong)(0x37 - uVar2));
    }
    else {
      if (uVar2 != 0x3f) {
        memset((void *)((ulong)(uVar2 + 1) + (long)data),0,(ulong)(uVar2 ^ 0x3f));
      }
      cmSHA256_Internal_Transform(context,(sha_word32 *)data);
      (context->s512).bitcount[1] = 0;
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x30] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x31] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x32] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x33] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x34] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x35] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x36] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x37] = '\0';
      (context->s512).state[7] = 0;
      (context->s512).bitcount[0] = 0;
      *data = 0;
      (context->s512).state[6] = 0;
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x38] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x39] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3a] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3b] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3c] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3d] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3e] = '\0';
      ((cm_sha2_uint8_t *)((long)context + 0x20))[0x3f] = '\0';
    }
  }
  *(cm_sha2_uint64_t *)((context->s256).buffer + 0x38) = (context->s256).bitcount;
  cmSHA256_Internal_Transform(context,(sha_word32 *)data);
  return;
}

Assistant:

void SHA256_Internal_Last(SHA_CTX* context) {
	unsigned int	usedspace;

	usedspace = (unsigned int)((context->s256.bitcount >> 3) % 64);
#if BYTE_ORDER == LITTLE_ENDIAN
	/* Convert FROM host byte order */
	REVERSE64(context->s256.bitcount,context->s256.bitcount);
#endif
	if (usedspace > 0) {
		/* Begin padding with a 1 bit: */
		context->s256.buffer[usedspace++] = 0x80;

		if (usedspace <= 56) {
			/* Set-up for the last transform: */
			MEMSET_BZERO(&context->s256.buffer[usedspace], 56 - usedspace);
		} else {
			if (usedspace < 64) {
				MEMSET_BZERO(&context->s256.buffer[usedspace], 64 - usedspace);
			}
			/* Do second-to-last transform: */
			SHA256_Internal_Transform(context, (const sha_word32*)context->s256.buffer);

			/* And set-up for the last transform: */
			MEMSET_BZERO(context->s256.buffer, 56);
		}
		/* Clean up: */
		usedspace = 0;
	} else {
		/* Set-up for the last transform: */
		MEMSET_BZERO(context->s256.buffer, 56);

		/* Begin padding with a 1 bit: */
		*context->s256.buffer = 0x80;
	}
	/* Set the bit count: */
	MEMCPY_BCOPY(&context->s256.buffer[56], &context->s256.bitcount,
		     sizeof(sha_word64));

	/* Final transform: */
	SHA256_Internal_Transform(context, (const sha_word32*)context->s256.buffer);
}